

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::GlobOperator,bool,false,false>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  bool *pbVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  idx_t iVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  unsigned_long *puVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  undefined8 local_88;
  char *local_80;
  undefined8 local_78;
  char *local_70;
  unsigned_long *local_68;
  ulong local_60;
  bool *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  bool *local_38;
  
  puVar10 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_58 = result_data;
  if (puVar10 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar14 = 8;
      iVar6 = 0;
      do {
        local_78 = *(ulong *)((long)ldata + lVar14 + -8);
        local_70 = *(char **)((long)&ldata->value + lVar14);
        local_88 = *(ulong *)((long)rdata + lVar14 + -8);
        local_80 = *(char **)((long)&rdata->value + lVar14);
        pcVar8 = local_70;
        if ((uint)local_78 < 0xd) {
          pcVar8 = (char *)((long)&local_78 + 4);
        }
        pcVar4 = local_80;
        if ((uint)local_88 < 0xd) {
          pcVar4 = (char *)((long)&local_88 + 4);
        }
        bVar2 = Glob(pcVar8,local_78 & 0xffffffff,pcVar4,local_88 & 0xffffffff,true);
        local_58[iVar6] = bVar2;
        iVar6 = iVar6 + 1;
        lVar14 = lVar14 + 0x10;
      } while (count != iVar6);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar3 = count + 0x3f >> 6;
    local_60 = 0;
    uVar11 = 0;
    local_68 = puVar10;
    local_50 = uVar3;
    local_40 = count;
    do {
      pbVar1 = local_58;
      uVar13 = puVar10[local_60];
      uVar7 = uVar11 + 0x40;
      if (local_40 <= uVar11 + 0x40) {
        uVar7 = local_40;
      }
      uVar9 = uVar7;
      if (uVar13 != 0) {
        uVar9 = uVar11;
        if (uVar13 == 0xffffffffffffffff) {
          if (uVar11 < uVar7) {
            uVar13 = uVar11 << 4 | 8;
            do {
              local_78 = *(ulong *)((long)ldata + (uVar13 - 8));
              local_70 = *(char **)((long)&ldata->value + uVar13);
              local_88 = *(ulong *)((long)rdata + (uVar13 - 8));
              local_80 = *(char **)((long)&rdata->value + uVar13);
              pcVar8 = local_70;
              if ((uint)local_78 < 0xd) {
                pcVar8 = (char *)((long)&local_78 + 4);
              }
              pcVar4 = local_80;
              if ((uint)local_88 < 0xd) {
                pcVar4 = (char *)((long)&local_88 + 4);
              }
              bVar2 = Glob(pcVar8,local_78 & 0xffffffff,pcVar4,local_88 & 0xffffffff,true);
              pbVar1[uVar11] = bVar2;
              uVar11 = uVar11 + 1;
              uVar13 = uVar13 + 0x10;
              uVar3 = local_50;
              uVar9 = uVar7;
              puVar10 = local_68;
            } while (uVar7 != uVar11);
          }
        }
        else {
          puVar10 = local_68;
          if (uVar11 < uVar7) {
            local_38 = local_58 + uVar11;
            uVar12 = uVar11 << 4 | 8;
            uVar5 = 0;
            local_48 = uVar7;
            do {
              if ((uVar13 >> (uVar5 & 0x3f) & 1) != 0) {
                local_78 = *(ulong *)((long)ldata + (uVar12 - 8));
                local_70 = *(char **)((long)&ldata->value + uVar12);
                local_88 = *(ulong *)((long)rdata + (uVar12 - 8));
                local_80 = *(char **)((long)&rdata->value + uVar12);
                pcVar8 = local_70;
                if ((uint)local_78 < 0xd) {
                  pcVar8 = (char *)((long)&local_78 + 4);
                }
                pcVar4 = local_80;
                if ((uint)local_88 < 0xd) {
                  pcVar4 = (char *)((long)&local_88 + 4);
                }
                bVar2 = Glob(pcVar8,local_78 & 0xffffffff,pcVar4,local_88 & 0xffffffff,true);
                local_38[uVar5] = bVar2;
              }
              uVar5 = uVar5 + 1;
              uVar12 = uVar12 + 0x10;
              uVar3 = local_50;
              uVar9 = local_48;
              puVar10 = local_68;
            } while (uVar7 - uVar11 != uVar5);
          }
        }
      }
      local_60 = local_60 + 1;
      uVar11 = uVar9;
    } while (local_60 != uVar3);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}